

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

char * testing::TestPartResultTypeToString(Type type)

{
  Type type_local;
  char *local_8;
  
  if (type == kSuccess) {
    local_8 = "Success";
  }
  else if (type - kNonFatalFailure < 2) {
    local_8 = "Failure\n";
  }
  else {
    local_8 = "Unknown result type";
  }
  return local_8;
}

Assistant:

static const char * TestPartResultTypeToString(TestPartResult::Type type) {
  switch (type) {
    case TestPartResult::kSuccess:
      return "Success";

    case TestPartResult::kNonFatalFailure:
    case TestPartResult::kFatalFailure:
#ifdef _MSC_VER
      return "error: ";
#else
      return "Failure\n";
#endif
    default:
      return "Unknown result type";
  }
}